

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O3

Abc_Obj_t *
Abc_NodeBddToMuxes_rec(DdManager *dd,DdNode *bFunc,Abc_Ntk_t *pNtkNew,st__table *tBdd2Node)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pNode1;
  DdNode *key;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pNodeNewC;
  Abc_Obj_t *local_40;
  Abc_Obj_t *local_38;
  
  if (((ulong)bFunc & 1) != 0) {
    __assert_fail("!Cudd_IsComplement(bFunc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                  ,0xef,
                  "Abc_Obj_t *Abc_NodeBddToMuxes_rec(DdManager *, DdNode *, Abc_Ntk_t *, st__table *)"
                 );
  }
  if (dd->one != bFunc) {
    iVar1 = st__lookup(tBdd2Node,(char *)bFunc,(char **)&local_40);
    if (iVar1 == 0) {
      pAVar2 = Abc_NodeBddToMuxes_rec
                         (dd,(DdNode *)((ulong)(bFunc->type).kids.E & 0xfffffffffffffffe),pNtkNew,
                          tBdd2Node);
      if ((undefined1  [16])((undefined1  [16])bFunc->type & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        pAVar2 = Abc_NtkCreateNodeInv(pNtkNew,pAVar2);
      }
      pNode1 = Abc_NodeBddToMuxes_rec(dd,(bFunc->type).kids.T,pNtkNew,tBdd2Node);
      key = Cudd_bddIthVar(dd,bFunc->index);
      iVar1 = st__lookup(tBdd2Node,(char *)key,(char **)&local_38);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                      ,0xfa,
                      "Abc_Obj_t *Abc_NodeBddToMuxes_rec(DdManager *, DdNode *, Abc_Ntk_t *, st__table *)"
                     );
      }
      local_40 = Abc_NtkCreateNodeMux(pNtkNew,local_38,pNode1,pAVar2);
      st__insert(tBdd2Node,(char *)bFunc,(char *)local_40);
    }
    return local_40;
  }
  pAVar2 = Abc_NtkCreateNodeConst1(pNtkNew);
  return pAVar2;
}

Assistant:

Abc_Obj_t * Abc_NodeBddToMuxes_rec( DdManager * dd, DdNode * bFunc, Abc_Ntk_t * pNtkNew, st__table * tBdd2Node )
{
    Abc_Obj_t * pNodeNew, * pNodeNew0, * pNodeNew1, * pNodeNewC;
    assert( !Cudd_IsComplement(bFunc) );
    if ( bFunc == b1 )
        return Abc_NtkCreateNodeConst1(pNtkNew);
    if ( st__lookup( tBdd2Node, (char *)bFunc, (char **)&pNodeNew ) )
        return pNodeNew;
    // solve for the children nodes
    pNodeNew0 = Abc_NodeBddToMuxes_rec( dd, Cudd_Regular(cuddE(bFunc)), pNtkNew, tBdd2Node );
    if ( Cudd_IsComplement(cuddE(bFunc)) )
        pNodeNew0 = Abc_NtkCreateNodeInv( pNtkNew, pNodeNew0 );
    pNodeNew1 = Abc_NodeBddToMuxes_rec( dd, cuddT(bFunc), pNtkNew, tBdd2Node );
    if ( ! st__lookup( tBdd2Node, (char *)Cudd_bddIthVar(dd, bFunc->index), (char **)&pNodeNewC ) )
        assert( 0 );
    // create the MUX node
    pNodeNew = Abc_NtkCreateNodeMux( pNtkNew, pNodeNewC, pNodeNew1, pNodeNew0 );
    st__insert( tBdd2Node, (char *)bFunc, (char *)pNodeNew );
    return pNodeNew;
}